

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O3

int xmlSchemaCompareValuesInternal
              (xmlSchemaValType xtype,xmlSchemaValPtr x,xmlChar *xvalue,
              xmlSchemaWhitespaceValueType xws,xmlSchemaValType ytype,xmlSchemaValPtr y,
              xmlChar *yvalue,xmlSchemaWhitespaceValueType yws)

{
  ushort uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  xmlSchemaValPtr pxVar5;
  long lVar6;
  xmlSchemaValPtr pxVar7;
  long lVar8;
  xmlGenericErrorFunc *pp_Var9;
  void **ppvVar10;
  uint uVar11;
  undefined8 uVar12;
  uint uVar13;
  xmlGenericErrorFunc p_Var14;
  xmlChar *pxVar15;
  uint uVar16;
  uint uVar17;
  void *pvVar18;
  uint uVar19;
  uint uVar20;
  double dVar21;
  double dVar22;
  xmlSchemaValPtr local_40;
  
  uVar20 = 0xfffffffe;
  switch(xtype) {
  case XML_SCHEMAS_STRING:
  case XML_SCHEMAS_NORMSTRING:
  case XML_SCHEMAS_TOKEN:
  case XML_SCHEMAS_LANGUAGE:
  case XML_SCHEMAS_NMTOKEN:
  case XML_SCHEMAS_NAME:
  case XML_SCHEMAS_NCNAME:
  case XML_SCHEMAS_ID:
  case XML_SCHEMAS_IDREF:
  case XML_SCHEMAS_ENTITY:
  case XML_SCHEMAS_ANYURI:
  case XML_SCHEMAS_ANYSIMPLETYPE:
    if (x != (xmlSchemaValPtr)0x0) {
      xvalue = (x->value).qname.name;
    }
    if (y != (xmlSchemaValPtr)0x0) {
      yvalue = (y->value).qname.name;
    }
    if (XML_SCHEMAS_ANYSIMPLETYPE < ytype) {
      return -2;
    }
    if ((0x400025d70006U >> ((ulong)ytype & 0x3f) & 1) != 0) {
      if (xws == XML_SCHEMA_WHITESPACE_COLLAPSE) {
        if (yws == XML_SCHEMA_WHITESPACE_COLLAPSE) {
          iVar3 = xmlSchemaCompareNormStrings(xvalue,yvalue);
          return iVar3;
        }
        if (yws == XML_SCHEMA_WHITESPACE_REPLACE) {
          iVar3 = 1;
          pxVar15 = xvalue;
          xvalue = yvalue;
LAB_001d16ac:
          iVar3 = xmlSchemaCompareReplaceCollapseStrings(xvalue,pxVar15,iVar3);
          return iVar3;
        }
        if (yws != XML_SCHEMA_WHITESPACE_PRESERVE) {
          return -2;
        }
        iVar3 = 1;
        pxVar15 = xvalue;
        xvalue = yvalue;
LAB_001d16f2:
        iVar3 = xmlSchemaComparePreserveCollapseStrings(xvalue,pxVar15,iVar3);
        return iVar3;
      }
      if (xws == XML_SCHEMA_WHITESPACE_REPLACE) {
        if (yws == XML_SCHEMA_WHITESPACE_COLLAPSE) {
          iVar3 = 0;
          pxVar15 = yvalue;
          goto LAB_001d16ac;
        }
        if (yws == XML_SCHEMA_WHITESPACE_REPLACE) {
          iVar3 = xmlSchemaCompareReplacedStrings(xvalue,yvalue);
          return iVar3;
        }
        if (yws != XML_SCHEMA_WHITESPACE_PRESERVE) {
          return -2;
        }
        iVar3 = 1;
        pxVar15 = xvalue;
        xvalue = yvalue;
      }
      else {
        if (xws != XML_SCHEMA_WHITESPACE_PRESERVE) {
          return -2;
        }
        if (yws == XML_SCHEMA_WHITESPACE_COLLAPSE) {
          iVar3 = 0;
          pxVar15 = yvalue;
          goto LAB_001d16f2;
        }
        if (yws != XML_SCHEMA_WHITESPACE_REPLACE) {
          if (yws != XML_SCHEMA_WHITESPACE_PRESERVE) {
            return -2;
          }
          iVar3 = xmlStrEqual(xvalue,yvalue);
          uVar20 = (uint)(iVar3 == 0);
          goto LAB_001d1454;
        }
        iVar3 = 0;
        pxVar15 = yvalue;
      }
      iVar3 = xmlSchemaComparePreserveReplaceStrings(xvalue,pxVar15,iVar3);
      return iVar3;
    }
    if ((ulong)ytype != 0x15) {
      return -2;
    }
    pp_Var9 = __xmlGenericError();
    p_Var14 = *pp_Var9;
    ppvVar10 = __xmlGenericErrorContext();
    pvVar18 = *ppvVar10;
    uVar12 = 0x1306;
    goto LAB_001d1586;
  case XML_SCHEMAS_DECIMAL:
  case XML_SCHEMAS_INTEGER:
  case XML_SCHEMAS_NPINTEGER:
  case XML_SCHEMAS_NINTEGER:
  case XML_SCHEMAS_NNINTEGER:
  case XML_SCHEMAS_PINTEGER:
  case XML_SCHEMAS_INT:
  case XML_SCHEMAS_UINT:
  case XML_SCHEMAS_LONG:
  case XML_SCHEMAS_ULONG:
  case XML_SCHEMAS_SHORT:
  case XML_SCHEMAS_USHORT:
  case XML_SCHEMAS_BYTE:
  case XML_SCHEMAS_UBYTE:
    if ((y != (xmlSchemaValPtr)0x0 && x != (xmlSchemaValPtr)0x0) &&
       (((ytype == xtype || (ytype - XML_SCHEMAS_INTEGER < 0xd)) || (ytype == XML_SCHEMAS_DECIMAL)))
       ) {
      iVar3 = xmlSchemaCompareDecimals(x,y);
      return iVar3;
    }
    break;
  case XML_SCHEMAS_TIME:
  case XML_SCHEMAS_GDAY:
  case XML_SCHEMAS_GMONTH:
  case XML_SCHEMAS_GMONTHDAY:
  case XML_SCHEMAS_GYEAR:
  case XML_SCHEMAS_GYEARMONTH:
  case XML_SCHEMAS_DATE:
  case XML_SCHEMAS_DATETIME:
    if (7 < ytype - XML_SCHEMAS_TIME) {
      return -2;
    }
    if (x == (xmlSchemaValPtr)0x0) {
      return -2;
    }
    if (y == (xmlSchemaValPtr)0x0) {
      return -2;
    }
    if ((x->value).decimal.lo + 0xffa6784e56bb741b < 0xff4cf09cad76e837) {
      return -2;
    }
    if ((y->value).decimal.lo + 0xffa6784e56bb741b < 0xff4cf09cad76e837) {
      return -2;
    }
    uVar1 = *(ushort *)((long)&y->value + 0x18);
    if ((*(byte *)((long)&x->value + 0x18) & 1) == 0) {
      if ((uVar1 & 1) != 0) {
        pxVar5 = xmlSchemaDateNormalize(y,0.0);
        uVar20 = (pxVar5->value).hex.total;
        lVar6 = _xmlSchemaDateCastYMToDays((xmlSchemaValPtr)(pxVar5->value).qname.name);
        lVar6 = (ulong)(uVar20 >> 4 & 0x1f) + lVar6;
        pxVar7 = xmlSchemaDateNormalize(x,-50400.0);
        uVar20 = (pxVar7->value).hex.total;
        lVar8 = _xmlSchemaDateCastYMToDays((xmlSchemaValPtr)(pxVar7->value).qname.name);
        lVar8 = (ulong)(uVar20 >> 4 & 0x1f) + lVar8;
        if (lVar8 < lVar6) {
LAB_001d176a:
          xmlSchemaFreeValue(pxVar7);
          xmlSchemaFreeValue(pxVar5);
          goto LAB_001d17b4;
        }
        if (lVar8 == lVar6) {
          uVar11 = (pxVar5->value).hex.total;
          if ((double)(int)((((int)(short)((pxVar7->value).decimal.extra << 3) >> 4) +
                            (uVar20 >> 0xe & 0x3f)) * 0x3c + (uVar20 >> 9 & 0x1f) * 0xe10) +
              (pxVar7->value).date.sec <
              (double)(int)((((int)(short)((pxVar5->value).decimal.extra << 3) >> 4) +
                            (uVar11 >> 0xe & 0x3f)) * 0x3c + (uVar11 >> 9 & 0x1f) * 0xe10) +
              (pxVar5->value).date.sec) goto LAB_001d176a;
          local_40 = xmlSchemaDateNormalize(x,50400.0);
          uVar20 = (local_40->value).hex.total;
          lVar8 = _xmlSchemaDateCastYMToDays((xmlSchemaValPtr)(local_40->value).qname.name);
          lVar8 = (ulong)(uVar20 >> 4 & 0x1f) + lVar8;
          iVar3 = 0;
          if (lVar6 < lVar8) {
LAB_001d191a:
            iVar3 = 1;
          }
          else {
            bVar2 = true;
            if (lVar8 != lVar6) goto LAB_001d1c5a;
            dVar21 = (double)(int)((((int)(short)((local_40->value).decimal.extra << 3) >> 4) +
                                   (uVar20 >> 0xe & 0x3f)) * 0x3c + (uVar20 >> 9 & 0x1f) * 0xe10) +
                     (local_40->value).date.sec;
            uVar20 = (pxVar5->value).hex.total;
            dVar22 = (double)(int)((((int)(short)((pxVar5->value).decimal.extra << 3) >> 4) +
                                   (uVar20 >> 0xe & 0x3f)) * 0x3c + (uVar20 >> 9 & 0x1f) * 0xe10) +
                     (pxVar5->value).date.sec;
LAB_001d1c4a:
            iVar3 = (dVar21 <= dVar22) + 1;
          }
          bVar2 = false;
LAB_001d1c5a:
          xmlSchemaFreeValue(pxVar7);
          xmlSchemaFreeValue(pxVar5);
          xmlSchemaFreeValue(local_40);
          if (!bVar2) {
            return iVar3;
          }
        }
        else {
LAB_001d1925:
          xmlSchemaFreeValue(pxVar7);
          xmlSchemaFreeValue(pxVar5);
        }
      }
    }
    else if ((uVar1 & 1) == 0) {
      pxVar7 = xmlSchemaDateNormalize(x,0.0);
      uVar20 = (pxVar7->value).hex.total;
      lVar6 = _xmlSchemaDateCastYMToDays((xmlSchemaValPtr)(pxVar7->value).qname.name);
      lVar6 = (ulong)(uVar20 >> 4 & 0x1f) + lVar6;
      pxVar5 = xmlSchemaDateNormalize(y,50400.0);
      uVar20 = (pxVar5->value).hex.total;
      lVar8 = _xmlSchemaDateCastYMToDays((xmlSchemaValPtr)(pxVar5->value).qname.name);
      lVar8 = (ulong)(uVar20 >> 4 & 0x1f) + lVar8;
      if (lVar8 <= lVar6) {
        if (lVar6 != lVar8) goto LAB_001d1925;
        uVar11 = (pxVar7->value).hex.total;
        if ((double)(int)((((int)(short)((pxVar5->value).decimal.extra << 3) >> 4) +
                          (uVar20 >> 0xe & 0x3f)) * 0x3c + (uVar20 >> 9 & 0x1f) * 0xe10) +
            (pxVar5->value).date.sec <=
            (double)(int)((((int)(short)((pxVar7->value).decimal.extra << 3) >> 4) +
                          (uVar11 >> 0xe & 0x3f)) * 0x3c + (uVar11 >> 9 & 0x1f) * 0xe10) +
            (pxVar7->value).date.sec) {
          local_40 = xmlSchemaDateNormalize(y,-50400.0);
          uVar20 = (local_40->value).hex.total;
          lVar8 = _xmlSchemaDateCastYMToDays((xmlSchemaValPtr)(local_40->value).qname.name);
          lVar8 = (ulong)(uVar20 >> 4 & 0x1f) + lVar8;
          iVar3 = 0;
          if (lVar8 < lVar6) goto LAB_001d191a;
          bVar2 = true;
          if (lVar6 == lVar8) {
            uVar11 = (pxVar7->value).hex.total;
            dVar21 = (double)(int)((((int)(short)((pxVar7->value).decimal.extra << 3) >> 4) +
                                   (uVar11 >> 0xe & 0x3f)) * 0x3c + (uVar11 >> 9 & 0x1f) * 0xe10) +
                     (pxVar7->value).date.sec;
            dVar22 = (double)(int)((((int)(short)((local_40->value).decimal.extra << 3) >> 4) +
                                   (uVar20 >> 0xe & 0x3f)) * 0x3c + (uVar20 >> 9 & 0x1f) * 0xe10) +
                     (local_40->value).date.sec;
            goto LAB_001d1c4a;
          }
          goto LAB_001d1c5a;
        }
      }
      goto LAB_001d176a;
    }
    if (x->type == y->type) {
      pxVar5 = xmlSchemaDateNormalize(y,0.0);
      uVar20 = (pxVar5->value).hex.total;
      lVar6 = _xmlSchemaDateCastYMToDays((xmlSchemaValPtr)(pxVar5->value).qname.name);
      lVar6 = (ulong)(uVar20 >> 4 & 0x1f) + lVar6;
      pxVar7 = xmlSchemaDateNormalize(x,0.0);
      uVar20 = (pxVar7->value).hex.total;
      lVar8 = _xmlSchemaDateCastYMToDays((xmlSchemaValPtr)(pxVar7->value).qname.name);
      lVar8 = (ulong)(uVar20 >> 4 & 0x1f) + lVar8;
      iVar3 = -1;
      if ((lVar6 <= lVar8) &&
         ((lVar6 < lVar8 ||
          ((uVar11 = (pxVar5->value).hex.total,
           dVar22 = ((double)(int)((((int)(short)((pxVar7->value).decimal.extra << 3) >> 4) +
                                   (uVar20 >> 0xe & 0x3f)) * 0x3c + (uVar20 >> 9 & 0x1f) * 0xe10) +
                    (pxVar7->value).date.sec) -
                    ((double)(int)((((int)(short)((pxVar5->value).decimal.extra << 3) >> 4) +
                                   (uVar11 >> 0xe & 0x3f)) * 0x3c + (uVar11 >> 9 & 0x1f) * 0xe10) +
                    (pxVar5->value).date.sec), 0.0 <= dVar22 && (iVar3 = 0, 0.0 < dVar22)))))) {
        iVar3 = 1;
      }
      xmlSchemaFreeValue(pxVar7);
      xmlSchemaFreeValue(pxVar5);
      return iVar3;
    }
    uVar16 = x->type - XML_SCHEMAS_TIME;
    uVar11 = 0;
    uVar20 = 0;
    if (uVar16 < 8) {
      uVar20 = *(uint *)(&DAT_00208c50 + (ulong)uVar16 * 4);
    }
    uVar16 = y->type - XML_SCHEMAS_TIME;
    if (uVar16 < 8) {
      uVar11 = *(uint *)(&DAT_00208c50 + (ulong)uVar16 * 4);
    }
    uVar16 = uVar11 ^ uVar20;
    if ((uVar16 & 1) == 0) {
      uVar13 = uVar11 & uVar20;
      if ((uVar13 & 1) != 0) {
        lVar6 = (y->value).date.year;
        lVar8 = (x->value).date.year;
        if (lVar8 < lVar6) {
          return -1;
        }
        if (lVar6 < lVar8) {
          return 1;
        }
      }
      if ((uVar16 & 2) == 0) {
        if ((uVar13 & 2) != 0) {
          uVar17 = (x->value).hex.total & 0xf;
          uVar19 = (y->value).hex.total & 0xf;
          if (uVar17 < uVar19) {
            return -1;
          }
          if (uVar17 >= uVar19 && uVar17 != uVar19) {
            return 1;
          }
        }
        if ((uVar16 & 4) == 0) {
          if ((uVar13 & 4) != 0) {
            uVar16 = (x->value).hex.total >> 4 & 0x1f;
            uVar17 = (y->value).hex.total >> 4 & 0x1f;
            if (uVar16 < uVar17) {
              return -1;
            }
            if (uVar16 >= uVar17 && uVar16 != uVar17) {
              return 1;
            }
          }
          if (uVar20 != uVar11) {
            return 2;
          }
          if (uVar13 < 8) {
            return 0;
          }
          uVar20 = (x->value).hex.total;
          uVar16 = uVar20 >> 9 & 0x1f;
          uVar11 = (y->value).hex.total;
          uVar13 = uVar11 >> 9 & 0x1f;
          if (uVar16 < uVar13) {
            return -1;
          }
          if (uVar16 <= uVar13) {
            uVar20 = uVar20 >> 0xe & 0x3f;
            uVar11 = uVar11 >> 0xe & 0x3f;
            if (uVar20 < uVar11) {
              return -1;
            }
            if (uVar20 <= uVar11) {
              dVar22 = (x->value).date.sec;
              dVar21 = (y->value).date.sec;
              if (dVar22 < dVar21) {
                return -1;
              }
              if (dVar22 <= dVar21) {
                return 0;
              }
              return 1;
            }
          }
          return 1;
        }
      }
    }
    goto LAB_001d1a9f;
  case XML_SCHEMAS_DURATION:
    if (((ytype == XML_SCHEMAS_DURATION) && (x != (xmlSchemaValPtr)0x0)) &&
       (y != (xmlSchemaValPtr)0x0)) {
      iVar3 = xmlSchemaCompareDurations(x,y);
      return iVar3;
    }
    break;
  case XML_SCHEMAS_FLOAT:
  case XML_SCHEMAS_DOUBLE:
    if (1 < ytype - XML_SCHEMAS_FLOAT) {
      return -2;
    }
    if (x == (xmlSchemaValPtr)0x0) {
      return -2;
    }
    if (y == (xmlSchemaValPtr)0x0) {
      return -2;
    }
    if (x->type == XML_SCHEMAS_FLOAT) {
      dVar22 = (double)(x->value).f;
    }
    else {
      if (x->type != XML_SCHEMAS_DOUBLE) {
        return -2;
      }
      dVar22 = (x->value).d;
    }
    if (y->type == XML_SCHEMAS_FLOAT) {
      dVar21 = (double)(y->value).f;
    }
    else {
      if (y->type != XML_SCHEMAS_DOUBLE) {
        return -2;
      }
      dVar21 = (y->value).d;
    }
    iVar3 = xmlXPathIsNaN(dVar22);
    iVar4 = xmlXPathIsNaN(dVar21);
    if (iVar3 != 0) {
      return (uint)(iVar4 == 0);
    }
    if (iVar4 != 0) {
      return -1;
    }
    if ((dVar22 == xmlXPathPINF) && (!NAN(dVar22) && !NAN(xmlXPathPINF))) {
      return -(uint)(dVar21 != xmlXPathPINF) & 1;
    }
    if ((dVar21 == xmlXPathPINF) && (!NAN(dVar21) && !NAN(xmlXPathPINF))) {
      return -1;
    }
    if ((dVar22 == xmlXPathNINF) && (!NAN(dVar22) && !NAN(xmlXPathNINF))) {
      return -(uint)(dVar21 != xmlXPathNINF);
    }
    if ((dVar21 == xmlXPathNINF) && (!NAN(dVar21) && !NAN(xmlXPathNINF))) {
      return 1;
    }
    if (dVar22 < dVar21) {
      return -1;
    }
    if (dVar21 < dVar22) {
      return 1;
    }
    uVar20 = -(uint)(dVar22 != dVar21) & 1;
LAB_001d1454:
    return uVar20 * 2;
  case XML_SCHEMAS_BOOLEAN:
    if (ytype != XML_SCHEMAS_BOOLEAN) {
      return -2;
    }
    if (x == (xmlSchemaValPtr)0x0) {
      return -2;
    }
    if (y == (xmlSchemaValPtr)0x0) {
      return -2;
    }
    if ((x->value).b == (y->value).b) {
      return 0;
    }
    uVar20 = -(uint)((x->value).b == 0);
    goto LAB_001d17d3;
  case XML_SCHEMAS_NMTOKENS:
  case XML_SCHEMAS_IDREFS:
  case XML_SCHEMAS_ENTITIES:
    pp_Var9 = __xmlGenericError();
    p_Var14 = *pp_Var9;
    ppvVar10 = __xmlGenericErrorContext();
    pvVar18 = *ppvVar10;
    uVar12 = 0x1383;
LAB_001d1586:
    (*p_Var14)(pvVar18,"Unimplemented block at %s:%d\n",
               "/workspace/llm4binary/github/license_all_cmakelists_25/JFLarvoire[P]libxml2/xmlschemastypes.c"
               ,uVar12);
    break;
  case XML_SCHEMAS_QNAME:
  case XML_SCHEMAS_NOTATION:
    if (y == (xmlSchemaValPtr)0x0 || x == (xmlSchemaValPtr)0x0) {
      return -2;
    }
    if ((ytype != XML_SCHEMAS_NOTATION) && (ytype != XML_SCHEMAS_QNAME)) {
      return -2;
    }
    iVar3 = xmlStrEqual((x->value).qname.name,(y->value).qname.name);
    if ((iVar3 != 0) && (iVar3 = xmlStrEqual((x->value).qname.uri,(y->value).qname.uri), iVar3 != 0)
       ) {
      return 0;
    }
LAB_001d1a9f:
    uVar20 = 2;
    break;
  case XML_SCHEMAS_HEXBINARY:
    if (ytype != XML_SCHEMAS_HEXBINARY) {
      return -2;
    }
    if (x == (xmlSchemaValPtr)0x0) {
      return -2;
    }
    if (y == (xmlSchemaValPtr)0x0) {
      return -2;
    }
    uVar20 = (y->value).hex.total;
    uVar11 = (x->value).hex.total;
    if (uVar11 == uVar20) {
      iVar3 = xmlStrcmp((x->value).qname.name,(y->value).qname.name);
      if (0 < iVar3) {
        return 1;
      }
      if (iVar3 == 0) {
        return 0;
      }
    }
    else if (uVar20 < uVar11) {
      return 1;
    }
LAB_001d17b4:
    uVar20 = 0xffffffff;
    break;
  case XML_SCHEMAS_BASE64BINARY:
    if (ytype != XML_SCHEMAS_BASE64BINARY) {
      return -2;
    }
    if (x == (xmlSchemaValPtr)0x0) {
      return -2;
    }
    if (y == (xmlSchemaValPtr)0x0) {
      return -2;
    }
    uVar20 = (x->value).hex.total;
    uVar11 = (y->value).hex.total;
    if (uVar20 == uVar11) {
      iVar3 = xmlStrcmp((x->value).qname.name,(y->value).qname.name);
      if (iVar3 < 1) {
        return -(uint)(iVar3 != 0);
      }
      return 1;
    }
    uVar20 = (uVar11 < uVar20) - 1;
LAB_001d17d3:
    uVar20 = uVar20 | 1;
  }
  return uVar20;
}

Assistant:

static int
xmlSchemaCompareValuesInternal(xmlSchemaValType xtype,
			       xmlSchemaValPtr x,
			       const xmlChar *xvalue,
			       xmlSchemaWhitespaceValueType xws,
			       xmlSchemaValType ytype,
			       xmlSchemaValPtr y,
			       const xmlChar *yvalue,
			       xmlSchemaWhitespaceValueType yws)
{
    switch (xtype) {
	case XML_SCHEMAS_UNKNOWN:
	case XML_SCHEMAS_ANYTYPE:
	    return(-2);
        case XML_SCHEMAS_INTEGER:
        case XML_SCHEMAS_NPINTEGER:
        case XML_SCHEMAS_NINTEGER:
        case XML_SCHEMAS_NNINTEGER:
        case XML_SCHEMAS_PINTEGER:
        case XML_SCHEMAS_INT:
        case XML_SCHEMAS_UINT:
        case XML_SCHEMAS_LONG:
        case XML_SCHEMAS_ULONG:
        case XML_SCHEMAS_SHORT:
        case XML_SCHEMAS_USHORT:
        case XML_SCHEMAS_BYTE:
        case XML_SCHEMAS_UBYTE:
	case XML_SCHEMAS_DECIMAL:
	    if ((x == NULL) || (y == NULL))
		return(-2);
	    if (ytype == xtype)
		return(xmlSchemaCompareDecimals(x, y));
	    if ((ytype == XML_SCHEMAS_DECIMAL) ||
		(ytype == XML_SCHEMAS_INTEGER) ||
		(ytype == XML_SCHEMAS_NPINTEGER) ||
		(ytype == XML_SCHEMAS_NINTEGER) ||
		(ytype == XML_SCHEMAS_NNINTEGER) ||
		(ytype == XML_SCHEMAS_PINTEGER) ||
		(ytype == XML_SCHEMAS_INT) ||
		(ytype == XML_SCHEMAS_UINT) ||
		(ytype == XML_SCHEMAS_LONG) ||
		(ytype == XML_SCHEMAS_ULONG) ||
		(ytype == XML_SCHEMAS_SHORT) ||
		(ytype == XML_SCHEMAS_USHORT) ||
		(ytype == XML_SCHEMAS_BYTE) ||
		(ytype == XML_SCHEMAS_UBYTE))
		return(xmlSchemaCompareDecimals(x, y));
	    return(-2);
        case XML_SCHEMAS_DURATION:
	    if ((x == NULL) || (y == NULL))
		return(-2);
	    if (ytype == XML_SCHEMAS_DURATION)
                return(xmlSchemaCompareDurations(x, y));
            return(-2);
        case XML_SCHEMAS_TIME:
        case XML_SCHEMAS_GDAY:
        case XML_SCHEMAS_GMONTH:
        case XML_SCHEMAS_GMONTHDAY:
        case XML_SCHEMAS_GYEAR:
        case XML_SCHEMAS_GYEARMONTH:
        case XML_SCHEMAS_DATE:
        case XML_SCHEMAS_DATETIME:
	    if ((x == NULL) || (y == NULL))
		return(-2);
            if ((ytype == XML_SCHEMAS_DATETIME)  ||
                (ytype == XML_SCHEMAS_TIME)      ||
                (ytype == XML_SCHEMAS_GDAY)      ||
                (ytype == XML_SCHEMAS_GMONTH)    ||
                (ytype == XML_SCHEMAS_GMONTHDAY) ||
                (ytype == XML_SCHEMAS_GYEAR)     ||
                (ytype == XML_SCHEMAS_DATE)      ||
                (ytype == XML_SCHEMAS_GYEARMONTH))
                return (xmlSchemaCompareDates(x, y));
            return (-2);
	/*
	* Note that we will support comparison of string types against
	* anySimpleType as well.
	*/
	case XML_SCHEMAS_ANYSIMPLETYPE:
	case XML_SCHEMAS_STRING:
        case XML_SCHEMAS_NORMSTRING:
        case XML_SCHEMAS_TOKEN:
        case XML_SCHEMAS_LANGUAGE:
        case XML_SCHEMAS_NMTOKEN:
        case XML_SCHEMAS_NAME:
        case XML_SCHEMAS_NCNAME:
        case XML_SCHEMAS_ID:
        case XML_SCHEMAS_IDREF:
        case XML_SCHEMAS_ENTITY:
        case XML_SCHEMAS_ANYURI:
	{
	    const xmlChar *xv, *yv;

	    if (x == NULL)
		xv = xvalue;
	    else
		xv = x->value.str;
	    if (y == NULL)
		yv = yvalue;
	    else
		yv = y->value.str;
	    /*
	    * TODO: Compare those against QName.
	    */
	    if (ytype == XML_SCHEMAS_QNAME) {
		TODO
		if (y == NULL)
		    return(-2);
		return (-2);
	    }
            if ((ytype == XML_SCHEMAS_ANYSIMPLETYPE) ||
		(ytype == XML_SCHEMAS_STRING) ||
		(ytype == XML_SCHEMAS_NORMSTRING) ||
                (ytype == XML_SCHEMAS_TOKEN) ||
                (ytype == XML_SCHEMAS_LANGUAGE) ||
                (ytype == XML_SCHEMAS_NMTOKEN) ||
                (ytype == XML_SCHEMAS_NAME) ||
                (ytype == XML_SCHEMAS_NCNAME) ||
                (ytype == XML_SCHEMAS_ID) ||
                (ytype == XML_SCHEMAS_IDREF) ||
                (ytype == XML_SCHEMAS_ENTITY) ||
                (ytype == XML_SCHEMAS_ANYURI)) {

		if (xws == XML_SCHEMA_WHITESPACE_PRESERVE) {

		    if (yws == XML_SCHEMA_WHITESPACE_PRESERVE) {
			/* TODO: What about x < y or x > y. */
			if (xmlStrEqual(xv, yv))
			    return (0);
			else
			    return (2);
		    } else if (yws == XML_SCHEMA_WHITESPACE_REPLACE)
			return (xmlSchemaComparePreserveReplaceStrings(xv, yv, 0));
		    else if (yws == XML_SCHEMA_WHITESPACE_COLLAPSE)
			return (xmlSchemaComparePreserveCollapseStrings(xv, yv, 0));

		} else if (xws == XML_SCHEMA_WHITESPACE_REPLACE) {

		    if (yws == XML_SCHEMA_WHITESPACE_PRESERVE)
			return (xmlSchemaComparePreserveReplaceStrings(yv, xv, 1));
		    if (yws == XML_SCHEMA_WHITESPACE_REPLACE)
			return (xmlSchemaCompareReplacedStrings(xv, yv));
		    if (yws == XML_SCHEMA_WHITESPACE_COLLAPSE)
			return (xmlSchemaCompareReplaceCollapseStrings(xv, yv, 0));

		} else if (xws == XML_SCHEMA_WHITESPACE_COLLAPSE) {

		    if (yws == XML_SCHEMA_WHITESPACE_PRESERVE)
			return (xmlSchemaComparePreserveCollapseStrings(yv, xv, 1));
		    if (yws == XML_SCHEMA_WHITESPACE_REPLACE)
			return (xmlSchemaCompareReplaceCollapseStrings(yv, xv, 1));
		    if (yws == XML_SCHEMA_WHITESPACE_COLLAPSE)
			return (xmlSchemaCompareNormStrings(xv, yv));
		} else
		    return (-2);

	    }
            return (-2);
	}
        case XML_SCHEMAS_QNAME:
	case XML_SCHEMAS_NOTATION:
	    if ((x == NULL) || (y == NULL))
		return(-2);
            if ((ytype == XML_SCHEMAS_QNAME) ||
		(ytype == XML_SCHEMAS_NOTATION)) {
		if ((xmlStrEqual(x->value.qname.name, y->value.qname.name)) &&
		    (xmlStrEqual(x->value.qname.uri, y->value.qname.uri)))
		    return(0);
		return(2);
	    }
	    return (-2);
        case XML_SCHEMAS_FLOAT:
        case XML_SCHEMAS_DOUBLE:
	    if ((x == NULL) || (y == NULL))
		return(-2);
            if ((ytype == XML_SCHEMAS_FLOAT) ||
                (ytype == XML_SCHEMAS_DOUBLE))
                return (xmlSchemaCompareFloats(x, y));
            return (-2);
        case XML_SCHEMAS_BOOLEAN:
	    if ((x == NULL) || (y == NULL))
		return(-2);
            if (ytype == XML_SCHEMAS_BOOLEAN) {
		if (x->value.b == y->value.b)
		    return(0);
		if (x->value.b == 0)
		    return(-1);
		return(1);
	    }
	    return (-2);
        case XML_SCHEMAS_HEXBINARY:
	    if ((x == NULL) || (y == NULL))
		return(-2);
            if (ytype == XML_SCHEMAS_HEXBINARY) {
	        if (x->value.hex.total == y->value.hex.total) {
		    int ret = xmlStrcmp(x->value.hex.str, y->value.hex.str);
		    if (ret > 0)
			return(1);
		    else if (ret == 0)
			return(0);
		}
		else if (x->value.hex.total > y->value.hex.total)
		    return(1);

		return(-1);
            }
            return (-2);
        case XML_SCHEMAS_BASE64BINARY:
	    if ((x == NULL) || (y == NULL))
		return(-2);
            if (ytype == XML_SCHEMAS_BASE64BINARY) {
                if (x->value.base64.total == y->value.base64.total) {
                    int ret = xmlStrcmp(x->value.base64.str,
		                        y->value.base64.str);
                    if (ret > 0)
                        return(1);
                    else if (ret == 0)
                        return(0);
		    else
		        return(-1);
                }
                else if (x->value.base64.total > y->value.base64.total)
                    return(1);
                else
                    return(-1);
            }
            return (-2);
        case XML_SCHEMAS_IDREFS:
        case XML_SCHEMAS_ENTITIES:
        case XML_SCHEMAS_NMTOKENS:
	    TODO
	    break;
    }
    return -2;
}